

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Synth.h
# Opt level: O1

void __thiscall
Blip_Synth<2,_31>::offset(Blip_Synth<2,_31> *this,blip_time_t time,int delta,Blip_Buffer *buf)

{
  int iVar1;
  int iVar2;
  buf_t_ *pbVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  
  uVar7 = time * buf->factor_ + buf->offset_;
  uVar4 = (uint)(uVar7 >> 0x10) & 0xfffffffe;
  if (uVar4 < buf->buffer_size_) {
    uVar4 = uVar4 + 8;
    pbVar3 = buf->buffer_;
    uVar6 = (uint)(uVar7 >> 7) & 0x3f0;
    iVar5 = (this->impulse).offset * delta;
    lVar8 = 0;
    do {
      iVar1 = *(int *)(pbVar3 + (ulong)uVar4 + lVar8 * 4 + 2);
      iVar2 = *(int *)((long)this->impulses + lVar8 * 8 + (ulong)uVar6 + 4);
      *(int *)(pbVar3 + (ulong)uVar4 + lVar8 * 4) =
           *(int *)((long)this->impulses + lVar8 * 8 + (ulong)uVar6) * delta +
           (*(int *)(pbVar3 + (ulong)uVar4 + lVar8 * 4) - iVar5);
      *(int *)(pbVar3 + (ulong)uVar4 + lVar8 * 4 + 2) = iVar2 * delta + (iVar1 - iVar5);
      lVar8 = lVar8 + 1;
    } while ((int)lVar8 != 2);
    return;
  }
  __assert_fail("( \"Blip_Synth/Blip_wave: Went past end of buffer\", sample_index < blip_buf->buffer_size_ )"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/fgssfgss[P]NESEmulator/apu_emu/nes_apu/Blip_Synth.h"
                ,0x8e,
                "void Blip_Synth<2, 31>::offset_resampled(blip_resampled_time_t, int, Blip_Buffer *) const [quality = 2, range = 31]"
               );
}

Assistant:

void Blip_Synth<quality,range>::offset( blip_time_t time, int delta, Blip_Buffer* buf ) const {
	offset_resampled( time * buf->factor_ + buf->offset_, delta, buf );
}